

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O1

bool __thiscall
slang::CommandLine::parse
          (CommandLine *this,
          span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
          args,ParseOptions options)

{
  char *__s;
  char cVar1;
  string_view arg;
  CommandLine *this_00;
  int iVar2;
  path *ppVar3;
  undefined4 extraout_var;
  void *pvVar4;
  ulong uVar5;
  iterator iVar6;
  iterator iVar7;
  Option *pOVar8;
  runtime_error *this_01;
  path *ppVar9;
  undefined1 *__n;
  _Base_ptr p_Var10;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  aVar11;
  pointer pbVar12;
  undefined8 uVar13;
  _Alloc_hider _Var14;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  __s1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  aVar15;
  size_type __rlen;
  _Base_ptr p_Var16;
  string_view *psVar17;
  bool bVar18;
  string_view arg_00;
  string_view name;
  string_view fmt;
  string_view name_00;
  string_view fmt_00;
  string_view fmt_01;
  string_view arg_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  format_args args_00;
  string_view value_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  bool hadUnknowns;
  string nearest;
  string result;
  string_view value;
  bool local_182;
  char local_181;
  CommandLine *local_180;
  path local_178;
  path local_148;
  uint local_11c;
  string local_118;
  ParseOptions local_f4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  local_f0;
  _Base_ptr local_e8;
  string_view local_e0;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_d0;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  local_c8;
  _Base_ptr local_c0;
  _Base_ptr local_b8;
  ulong local_b0;
  string_view local_a8;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL> local_90
  ;
  _Base_ptr local_80;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_78;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  size_type local_60;
  string local_50;
  
  local_90 = args;
  if ((this->optionMap)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"No options defined");
LAB_001af3e3:
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (((uint)options >> 8 & 1) != 0) goto LAB_001aeb4b;
  if (args.size_ == 0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Expected at least one argument");
    goto LAB_001af3e3;
  }
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_148,args.data_,auto_format);
  if ((_Base_ptr)local_148._M_pathname._M_string_length == (_Base_ptr)0x0) {
LAB_001aeab4:
    std::filesystem::__cxx11::path::path(&local_178);
  }
  else {
    ppVar3 = &local_148;
    if ((~(byte)local_148._M_cmpts._M_impl._M_t.
                super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                ._M_t.
                super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                _M_head_impl & 3) != 0) {
      if ((((ulong)local_148._M_cmpts._M_impl._M_t.
                   super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                   .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                   _M_head_impl & 3) == 0) &&
         ((local_148._M_pathname._M_dataplus._M_p + -1)[local_148._M_pathname._M_string_length] !=
          '/')) {
        if (((ulong)local_148._M_cmpts._M_impl._M_t.
                    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                    _M_head_impl & 3) == 0) {
          ppVar3 = (path *)std::filesystem::__cxx11::path::_List::end();
        }
        else {
          ppVar3 = (path *)0x0;
        }
        ppVar9 = (path *)&ppVar3[-2]._M_cmpts;
        if (((ulong)local_148._M_cmpts._M_impl._M_t.
                    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                    _M_head_impl & 3) != 0) {
          ppVar9 = ppVar3;
        }
        ppVar3 = &local_148;
        if (((ulong)local_148._M_cmpts._M_impl._M_t.
                    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                    _M_head_impl & 3) == 0) {
          ppVar3 = ppVar9;
        }
        if ((~*(uint *)&(ppVar3->_M_cmpts)._M_impl._M_t.
                        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                        ._M_t & 3) == 0) {
          ppVar3 = &local_148;
          if (((ulong)local_148._M_cmpts._M_impl._M_t.
                      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                      _M_head_impl & 3) == 0) {
            ppVar3 = ppVar9;
          }
          goto LAB_001aeaa5;
        }
      }
      goto LAB_001aeab4;
    }
LAB_001aeaa5:
    std::filesystem::__cxx11::path::path(&local_178,ppVar3);
  }
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,local_178._M_pathname._M_dataplus._M_p,
             local_178._M_pathname._M_dataplus._M_p + local_178._M_pathname._M_string_length);
  std::__cxx11::string::operator=((string *)&this->programName,(string *)&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,(ulong)(local_118.field_2._M_allocated_capacity + 1))
    ;
  }
  std::filesystem::__cxx11::path::~path(&local_178);
  std::filesystem::__cxx11::path::~path(&local_148);
  local_90 = nonstd::span_lite::
             span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
             ::subspan(&local_90,1,0xffffffffffffffff);
LAB_001aeb4b:
  local_182 = false;
  aVar11.values_ = (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)0x0;
  if (local_90.size_ == 0) {
    bVar18 = true;
    p_Var16 = (_Base_ptr)0x0;
    local_f0.values_ = (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)0x0;
    local_e8 = (_Base_ptr)0x0;
  }
  else {
    local_11c = (uint)options >> 0x18;
    psVar17 = local_90.data_ + local_90.size_;
    local_d0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->errors;
    local_70 = &this->cmdIgnore;
    local_b8 = &(this->cmdIgnore)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_78 = &this->cmdRename;
    local_80 = &(this->cmdRename)._M_t._M_impl.super__Rb_tree_header._M_header;
    pOVar8 = (Option *)0x0;
    local_b0 = 0;
    local_e8 = (_Base_ptr)0x0;
    local_f0.values_ = (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)0x0;
    local_c0 = (_Base_ptr)0x0;
    local_c8.values_ = (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)0x0;
    pbVar12 = local_90.data_;
    local_180 = this;
    local_f4 = options;
    do {
      if (aVar11._0_4_ == 0) {
        p_Var16 = (_Base_ptr)pbVar12->_M_len;
        __s1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
                )pbVar12->_M_str;
        if (pOVar8 == (Option *)0x0) {
          if ((((_Base_ptr)0x1 < p_Var16) && ((local_b0 & 1) == 0)) &&
             ((bVar18 = ((__s1.values_)->field_0).bool_value, bVar18 == true || (bVar18 == true))))
          {
            if (p_Var16 == (_Base_ptr)0x2) {
              iVar2 = bcmp(__s1.values_,"--",2);
              if (iVar2 == 0) {
                local_b0 = CONCAT71((int7)(CONCAT44(extraout_var,iVar2) >> 8),1);
                goto LAB_001aee25;
              }
            }
            if ((local_180->cmdIgnore)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
LAB_001aeed6:
              aVar11.values_ = (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)0x0
              ;
              if ((local_180->cmdRename)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
                local_178._M_pathname._M_dataplus._M_p = (pointer)&local_178._M_pathname.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_178,__s1.values_,
                           (char *)((long)&p_Var16->_M_color + (long)&(__s1.values_)->field_0));
                iVar7 = std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::find(&local_78->_M_t,&local_178._M_pathname);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_178._M_pathname._M_dataplus._M_p != &local_178._M_pathname.field_2) {
                  operator_delete(local_178._M_pathname._M_dataplus._M_p,
                                  (ulong)(local_178._M_pathname.field_2._M_allocated_capacity + 1));
                }
                if (iVar7._M_node != local_80) {
                  __s1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
                          )((anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
                             *)(iVar7._M_node + 2))->values_;
                  p_Var16 = iVar7._M_node[2]._M_parent;
                }
              }
              this_00 = local_180;
              if (((__s1.values_)->field_0).bool_value != true) {
                if (p_Var16 == (_Base_ptr)0x0) {
LAB_001af424:
                  std::__throw_out_of_range_fmt
                            ("%s: __pos (which is %zu) > __size (which is %zu)",
                             "basic_string_view::substr",1,0);
                }
                local_e0._M_len = (long)&p_Var16[-1]._M_right + 7;
                local_e0._M_str = (char *)((long)&(__s1.values_)->field_0 + 1);
                cVar1 = *(char *)((long)&(__s1.values_)->field_0 + 1);
                if (cVar1 == '-') {
                  if ((_Base_ptr)local_e0._M_len == (_Base_ptr)0x0) goto LAB_001af424;
                  local_e0._M_len = (long)&p_Var16[-1]._M_right + 6;
                  local_e0._M_str = (char *)((long)&(__s1.values_)->field_0 + 2);
                }
                local_181 = cVar1 == '-';
                local_a8._M_len = 0;
                local_a8._M_str = (char *)0x0;
                arg._M_str = local_e0._M_str;
                arg._M_len = local_e0._M_len;
                pOVar8 = findOption(local_180,arg,&local_a8);
                aVar15 = __s1;
                p_Var10 = p_Var16;
                if ((pOVar8 == (Option *)0x0 && local_181 == '\0') &&
                   (pOVar8 = tryGroupOrPrefix(this_00,&local_e0,&local_a8,local_f4),
                   aVar15 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
                             )local_e0._M_str, p_Var10 = (_Base_ptr)local_e0._M_len,
                   pOVar8 == (Option *)0x0)) {
                  pOVar8 = (Option *)0x0;
                  aVar15 = __s1;
                  p_Var10 = p_Var16;
                }
                if (pOVar8 == (Option *)0x0) {
                  local_178._M_pathname._M_dataplus._M_p = (local_180->programName)._M_dataplus._M_p
                  ;
                  local_178._M_pathname._M_string_length = (local_180->programName)._M_string_length
                  ;
                  fmt_01.size_ = 0xdd;
                  fmt_01.data_ = (char *)0x26;
                  args_02.field_1.values_ = in_R9.values_;
                  args_02.desc_ = (unsigned_long_long)&local_178;
                  local_178._M_pathname.field_2._M_allocated_capacity = (size_type)aVar15;
                  local_178._M_pathname.field_2._8_8_ = p_Var10;
                  ::fmt::v9::vformat_abi_cxx11_
                            (&local_148._M_pathname,(v9 *)"{}: unknown command line argument \'{}\'"
                             ,fmt_01,args_02);
                  arg_01._M_str = (char *)aVar15.values_;
                  arg_01._M_len = (size_t)p_Var10;
                  findNearestMatch_abi_cxx11_(&local_178._M_pathname,local_180,arg_01);
                  if (local_178._M_pathname._M_string_length != 0) {
                    local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)local_178._M_pathname._M_dataplus._M_p;
                    local_60 = local_178._M_pathname._M_string_length;
                    fmt_02.size_ = 0xd;
                    fmt_02.data_ = (char *)0x14;
                    args_03.field_1.values_ = in_R9.values_;
                    args_03.desc_ = (unsigned_long_long)&local_68;
                    ::fmt::v9::vformat_abi_cxx11_
                              (&local_118,(v9 *)", did you mean \'{}\'?",fmt_02,args_03);
                    std::__cxx11::string::_M_append
                              ((char *)&local_148,(ulong)local_118._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_118._M_dataplus._M_p != &local_118.field_2) {
                      operator_delete(local_118._M_dataplus._M_p,
                                      (ulong)(local_118.field_2._M_allocated_capacity + 1));
                    }
                  }
                  local_182 = true;
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>(local_d0,&local_148._M_pathname);
                  uVar13 = local_178._M_pathname.field_2._M_allocated_capacity;
                  _Var14._M_p = local_178._M_pathname._M_dataplus._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_178._M_pathname._M_dataplus._M_p != &local_178._M_pathname.field_2) {
LAB_001af20b:
                    operator_delete(_Var14._M_p,
                                    (ulong)((long)&((
                                                  value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>
                                                  *)uVar13)->field_0 + 1));
                  }
                }
                else {
                  if ((local_a8._M_len == 0) &&
                     (*(__index_type *)
                       ((long)&(pOVar8->storage).
                               super__Variant_base<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<int,_std::allocator<int>_>_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<long,_std::allocator<long>_>_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
                               .
                               super__Move_assign_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
                               .
                               super__Copy_assign_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
                               .
                               super__Move_ctor_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
                               .
                               super__Copy_ctor_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
                               .
                               super__Variant_storage_alias<std::optional<bool>_*,_std::optional<int>_*,_std::optional<unsigned_int>_*,_std::optional<long>_*,_std::optional<unsigned_long>_*,_std::optional<double>_*,_std::optional<std::__cxx11::basic_string<char>_>_*,_std::vector<int>_*,_std::vector<unsigned_int>_*,_std::vector<long>_*,_std::vector<unsigned_long>_*,_std::vector<double>_*,_std::vector<std::__cxx11::basic_string<char>_>_*,_std::function<std::__cxx11::basic_string<char>_(std::basic_string_view<char>)>_>
                       + 0x20) != '\0')) goto LAB_001aee27;
                  name_00._M_str = (char *)aVar15.values_;
                  name_00._M_len = (size_t)p_Var10;
                  value_00._M_str = local_a8._M_str;
                  value_00._M_len = local_a8._M_len;
                  in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
                           )local_a8._M_str;
                  Option::set_abi_cxx11_
                            (&local_148._M_pathname,pOVar8,name_00,value_00,
                             (bool)((byte)local_11c & 1));
                  if ((_Base_ptr)local_148._M_pathname._M_string_length != (_Base_ptr)0x0) {
                    local_178._M_pathname._M_dataplus._M_p =
                         (local_180->programName)._M_dataplus._M_p;
                    local_178._M_pathname._M_string_length =
                         (local_180->programName)._M_string_length;
                    local_178._M_pathname.field_2._M_allocated_capacity =
                         (size_type)local_148._M_pathname._M_dataplus._M_p;
                    local_178._M_pathname.field_2._8_8_ = local_148._M_pathname._M_string_length;
                    fmt_00.size_ = 0xdd;
                    fmt_00.data_ = (char *)0x6;
                    args_01.field_1.values_ = in_R9.values_;
                    args_01.desc_ = (unsigned_long_long)&local_178;
                    ::fmt::v9::vformat_abi_cxx11_(&local_118,(v9 *)"{}: {}",fmt_00,args_01);
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>(local_d0,&local_118);
                    uVar13 = local_118.field_2._M_allocated_capacity;
                    _Var14._M_p = local_118._M_dataplus._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_118._M_dataplus._M_p != &local_118.field_2) goto LAB_001af20b;
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_148._M_pathname._M_dataplus._M_p != &local_148._M_pathname.field_2) {
                  operator_delete(local_148._M_pathname._M_dataplus._M_p,
                                  local_148._M_pathname.field_2._M_allocated_capacity + 1);
                }
                goto LAB_001aee25;
              }
              arg_00._M_str = (char *)__s1.values_;
              arg_00._M_len = (size_t)p_Var16;
              handlePlusArg(local_180,arg_00,local_f4,&local_182);
            }
            else {
              p_Var10 = p_Var16;
              if (bVar18 == true) {
                __n = (undefined1 *)((long)&p_Var16[-1]._M_right + 7);
                if (__n == (undefined1 *)0x0) {
                  uVar5 = 0xffffffffffffffff;
                }
                else {
                  __s = (char *)((long)&(__s1.values_)->field_0 + 1);
                  pvVar4 = memchr(__s,0x2b,(size_t)__n);
                  uVar5 = -(ulong)(pvVar4 == (void *)0x0) | (long)pvVar4 - (long)__s;
                }
                if ((uVar5 != 0xffffffffffffffff) && ((_Base_ptr)(uVar5 + 1) <= p_Var16)) {
                  p_Var10 = (_Base_ptr)(uVar5 + 1);
                }
              }
              local_178._M_pathname._M_dataplus._M_p = (pointer)&local_178._M_pathname.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_178,__s1.values_,
                         (char *)((long)&p_Var10->_M_color + (long)__s1.values_));
              iVar6 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::find(&local_70->_M_t,&local_178._M_pathname);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_178._M_pathname._M_dataplus._M_p != &local_178._M_pathname.field_2) {
                operator_delete(local_178._M_pathname._M_dataplus._M_p,
                                (ulong)(local_178._M_pathname.field_2._M_allocated_capacity + 1));
              }
              if (iVar6._M_node == local_b8) goto LAB_001aeed6;
              aVar11._4_4_ = 0;
              aVar11._0_4_ = iVar6._M_node[2]._M_color;
            }
            pOVar8 = (Option *)0x0;
            aVar15 = local_f0;
            p_Var10 = local_e8;
            goto LAB_001aee27;
          }
          if (local_c0 == (_Base_ptr)0x0) {
            local_c0 = p_Var16;
            local_c8 = __s1;
          }
          pOVar8 = (local_180->positional).
                   super___shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          ;
          if ((pOVar8 != (Option *)0x0) &&
             (Option::set_abi_cxx11_
                        (&local_50,pOVar8,(string_view)(ZEXT816(0x3d6541) << 0x40),*pbVar12,
                         (bool)((byte)local_11c & 1)),
             uVar13 = local_50.field_2._M_allocated_capacity,
             _Var14._M_p = local_50._M_dataplus._M_p, in_R9 = __s1,
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_50._M_dataplus._M_p != &local_50.field_2)) goto LAB_001aee1b;
        }
        else {
          name._M_str = (char *)local_f0.values_;
          name._M_len = (size_t)local_e8;
          Option::set_abi_cxx11_
                    (&local_148._M_pathname,pOVar8,name,*pbVar12,(bool)((byte)local_11c & 1));
          in_R9 = __s1;
          if ((_Base_ptr)local_148._M_pathname._M_string_length != (_Base_ptr)0x0) {
            local_178._M_pathname._M_dataplus._M_p = (local_180->programName)._M_dataplus._M_p;
            local_178._M_pathname._M_string_length = (local_180->programName)._M_string_length;
            local_178._M_pathname.field_2._M_allocated_capacity =
                 (size_type)local_148._M_pathname._M_dataplus._M_p;
            local_178._M_pathname.field_2._8_8_ = local_148._M_pathname._M_string_length;
            fmt.size_ = 0xdd;
            fmt.data_ = (char *)0x6;
            args_00.field_1.args_ = __s1.args_;
            args_00.desc_ = (unsigned_long_long)&local_178;
            ::fmt::v9::vformat_abi_cxx11_(&local_118,(v9 *)"{}: {}",fmt,args_00);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>(local_d0,&local_118);
            in_R9 = __s1;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              operator_delete(local_118._M_dataplus._M_p,
                              (ulong)(local_118.field_2._M_allocated_capacity + 1));
              in_R9 = __s1;
            }
          }
          uVar13 = local_148._M_pathname.field_2._M_allocated_capacity;
          _Var14._M_p = local_148._M_pathname._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_pathname._M_dataplus._M_p != &local_148._M_pathname.field_2) {
LAB_001aee1b:
            operator_delete(_Var14._M_p,uVar13 + 1);
          }
        }
LAB_001aee25:
        aVar11.values_ = (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)0x0;
        pOVar8 = (Option *)0x0;
        aVar15 = local_f0;
        p_Var10 = local_e8;
      }
      else {
        aVar11._0_4_ = aVar11._0_4_ - 1;
        aVar11._4_4_ = 0;
        aVar15 = local_f0;
        p_Var10 = local_e8;
      }
LAB_001aee27:
      local_e8 = p_Var10;
      local_f0 = aVar15;
      pbVar12 = pbVar12 + 1;
    } while (pbVar12 != psVar17);
    bVar18 = pOVar8 == (Option *)0x0;
    aVar11 = local_c8;
    this = local_180;
    p_Var16 = local_c0;
  }
  if (!bVar18) {
    local_178._M_pathname._M_dataplus._M_p = (this->programName)._M_dataplus._M_p;
    local_178._M_pathname._M_string_length = (this->programName)._M_string_length;
    local_178._M_pathname.field_2._M_allocated_capacity = (size_type)local_f0;
    local_178._M_pathname.field_2._8_8_ = local_e8;
    fmt_03.size_ = 0xdd;
    fmt_03.data_ = (char *)0x27;
    args_04.field_1.values_ = in_R9.values_;
    args_04.desc_ = (unsigned_long_long)&local_178;
    ::fmt::v9::vformat_abi_cxx11_
              (&local_148._M_pathname,(v9 *)"{}: no value provided for argument \'{}\'",fmt_03,
               args_04);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->errors,
               &local_148._M_pathname);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_pathname._M_dataplus._M_p != &local_148._M_pathname.field_2) {
      operator_delete(local_148._M_pathname._M_dataplus._M_p,
                      local_148._M_pathname.field_2._M_allocated_capacity + 1);
    }
  }
  if ((((this->positional).
        super___shared_ptr<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) && (p_Var16 != (_Base_ptr)0x0)) && (local_182 == false)) {
    local_178._M_pathname._M_dataplus._M_p = (this->programName)._M_dataplus._M_p;
    local_178._M_pathname._M_string_length = (this->programName)._M_string_length;
    fmt_04.size_ = 0xdd;
    fmt_04.data_ = (char *)0x38;
    args_05.field_1.values_ = in_R9.values_;
    args_05.desc_ = (unsigned_long_long)&local_178;
    local_178._M_pathname.field_2._M_allocated_capacity = (size_type)aVar11;
    local_178._M_pathname.field_2._8_8_ = p_Var16;
    ::fmt::v9::vformat_abi_cxx11_
              (&local_148._M_pathname,
               (v9 *)"{}: positional arguments are not allowed (see e.g. \'{}\')",fmt_04,args_05);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->errors,
               &local_148._M_pathname);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_pathname._M_dataplus._M_p != &local_148._M_pathname.field_2) {
      operator_delete(local_148._M_pathname._M_dataplus._M_p,
                      local_148._M_pathname.field_2._M_allocated_capacity + 1);
    }
  }
  return (this->errors).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         (this->errors).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool CommandLine::parse(span<const string_view> args, ParseOptions options) {
    if (optionMap.empty())
        throw std::runtime_error("No options defined");

    if (!options.ignoreProgramName) {
        if (args.empty())
            throw std::runtime_error("Expected at least one argument");

        programName = fs::path(fs::u8path(args[0])).filename().u8string();
        args = args.subspan(1);
    }

    Option* expectingVal = nullptr;
    string_view expectingValName;
    bool doubleDash = false;
    bool hadUnknowns = false;
    string_view firstPositional;

    int skip = 0;
    for (auto arg : args) {
        // Skip N arguments if needed (set by the cmdIgnore feature)
        if (skip) {
            skip--;
            continue;
        }

        // If we were previously expecting a value, set that now.
        if (expectingVal) {
            std::string result = expectingVal->set(expectingValName, arg, options.ignoreDuplicates);
            if (!result.empty())
                errors.emplace_back(fmt::format("{}: {}", programName, result));

            expectingVal = nullptr;
            continue;
        }

        // This is a positional argument if:
        // - Doesn't start with '-' and '+'
        // - Is exactly '-'
        // - Or we've seen a double dash already
        if (arg.length() <= 1 || doubleDash || (arg[0] != '-' && arg[0] != '+')) {
            if (firstPositional.empty())
                firstPositional = arg;

            if (positional)
                positional->set(""sv, arg, options.ignoreDuplicates);

            continue;
        }

        // Double dash indicates that all further arguments are positional.
        if (arg == "--"sv) {
            doubleDash = true;
            continue;
        }

        // Check if arg is in the list of commands to skip.
        if (!cmdIgnore.empty()) {
            // If we ignore a vendor command of the form +xx ,
            // we match on any +xx+yyy command as +yy is the command's argument.
            string_view ignoreArg = arg;
            if (arg[0] == '+') {
                size_t plusIndex = arg.substr(1).find_first_of('+');
                if (plusIndex != string_view::npos) {
                    ignoreArg = arg.substr(0, plusIndex +
                                                  1); // +1 because we started from arg.substr(1)
                }
            }

            if (auto it = cmdIgnore.find(std::string(ignoreArg)); it != cmdIgnore.end()) {
                // if yes, find how many args to skip
                skip = it->second;
                continue;
            }
        }

        // Check if arg is in the list of commands to translate.
        if (!cmdRename.empty()) {
            if (auto it = cmdRename.find(std::string(arg)); it != cmdRename.end()) {
                // if yes, rename argument
                arg = it->second;
            }
        }

        // Handle plus args, which are treated differently from all others.
        if (arg[0] == '+') {
            handlePlusArg(arg, options, hadUnknowns);
            continue;
        }

        // Get the raw name without leading dashes.
        bool longName = false;
        string_view name = arg.substr(1);
        if (name[0] == '-') {
            longName = true;
            name = name.substr(1);
        }

        string_view value;
        auto option = findOption(name, value);

        // If we didn't find the option and there was only a single dash,
        // maybe this was actually a group of single-char options or a prefixed value.
        if (!option && !longName) {
            option = tryGroupOrPrefix(name, value, options);
            if (option)
                arg = name;
        }

        // If we still didn't find it, that's an error.
        if (!option) {
            // Try to find something close to give a better error message.
            auto error = fmt::format("{}: unknown command line argument '{}'"sv, programName, arg);
            auto nearest = findNearestMatch(arg);
            if (!nearest.empty())
                error += fmt::format(", did you mean '{}'?"sv, nearest);

            hadUnknowns = true;
            errors.emplace_back(std::move(error));
            continue;
        }

        // Otherwise, we found what we wanted. If we have a value already, go ahead
        // and set it. Otherwise if we're expecting a value, assume that it will come
        // in the next argument.
        if (value.empty() && option->expectsValue()) {
            expectingVal = option;
            expectingValName = arg;
        }
        else {
            std::string result = option->set(arg, value, options.ignoreDuplicates);
            if (!result.empty())
                errors.emplace_back(fmt::format("{}: {}", programName, result));
        }
    }

    if (expectingVal) {
        errors.emplace_back(fmt::format("{}: no value provided for argument '{}'"sv, programName,
                                        expectingValName));
    }

    if (!positional && !firstPositional.empty() && !hadUnknowns) {
        errors.emplace_back(
            fmt::format("{}: positional arguments are not allowed (see e.g. '{}')"sv, programName,
                        firstPositional));
    }

    return errors.empty();
}